

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaTypeFixupWhitespace(xmlSchemaTypePtr type)

{
  int iVar1;
  bool bVar2;
  xmlSchemaTypePtr local_28;
  xmlSchemaTypePtr anc;
  xmlSchemaFacetLinkPtr lin;
  xmlSchemaTypePtr type_local;
  
  if ((type->flags & 0x40U) == 0) {
    if ((type->flags & 0x80U) == 0) {
      if (type->facetSet != (xmlSchemaFacetLinkPtr)0x0) {
        for (anc = (xmlSchemaTypePtr)type->facetSet; anc != (xmlSchemaTypePtr)0x0;
            anc = *(xmlSchemaTypePtr *)anc) {
          if (anc->next->type == XML_SCHEMA_FACET_WHITESPACE) {
            iVar1 = *(int *)((long)&anc->next->annot + 4);
            if (iVar1 == 1) {
              type->flags = type->flags | 0x1000000;
            }
            else if (iVar1 == 2) {
              type->flags = type->flags | 0x2000000;
            }
            else {
              if (iVar1 != 3) {
                return -1;
              }
              type->flags = type->flags | 0x4000000;
            }
            return 0;
          }
        }
      }
      local_28 = type->baseType;
      while( true ) {
        bVar2 = false;
        if (local_28 != (xmlSchemaTypePtr)0x0) {
          bVar2 = local_28->builtInType != 0x2d;
        }
        if (!bVar2) {
          return 0;
        }
        if (local_28->type == XML_SCHEMA_TYPE_BASIC) break;
        local_28 = local_28->baseType;
      }
      if (local_28->builtInType == 2) {
        type->flags = type->flags | 0x2000000;
      }
      else if ((local_28->builtInType == 1) || (local_28->builtInType == 0x2e)) {
        type->flags = type->flags | 0x1000000;
      }
      else {
        type->flags = type->flags | 0x4000000;
      }
    }
  }
  else {
    type->flags = type->flags | 0x4000000;
  }
  return 0;
}

Assistant:

static int
xmlSchemaTypeFixupWhitespace(xmlSchemaTypePtr type)
{


    /*
    * Evaluate the whitespace-facet value.
    */
    if (WXS_IS_LIST(type)) {
	type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_COLLAPSE;
	return (0);
    } else if (WXS_IS_UNION(type))
	return (0);

    if (type->facetSet != NULL) {
	xmlSchemaFacetLinkPtr lin;

	for (lin = type->facetSet; lin != NULL; lin = lin->next) {
	    if (lin->facet->type == XML_SCHEMA_FACET_WHITESPACE) {
		switch (lin->facet->whitespace) {
		case XML_SCHEMAS_FACET_PRESERVE:
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_PRESERVE;
		    break;
		case XML_SCHEMAS_FACET_REPLACE:
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_REPLACE;
		    break;
		case XML_SCHEMAS_FACET_COLLAPSE:
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_COLLAPSE;
		    break;
		default:
		    return (-1);
		}
		return (0);
	    }
	}
    }
    /*
    * For all `atomic` datatypes other than string (and types `derived`
    * by `restriction` from it) the value of whiteSpace is fixed to
    * collapse
    */
    {
	xmlSchemaTypePtr anc;

	for (anc = type->baseType; anc != NULL &&
		anc->builtInType != XML_SCHEMAS_ANYTYPE;
		anc = anc->baseType) {

	    if (anc->type == XML_SCHEMA_TYPE_BASIC) {
		if (anc->builtInType == XML_SCHEMAS_NORMSTRING) {
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_REPLACE;

		} else if ((anc->builtInType == XML_SCHEMAS_STRING) ||
		    (anc->builtInType == XML_SCHEMAS_ANYSIMPLETYPE)) {
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_PRESERVE;

		} else
		    type->flags |= XML_SCHEMAS_TYPE_WHITESPACE_COLLAPSE;
		break;
	    }
	}
    }
    return (0);
}